

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::EndTable
          (FlatBufferBuilderImpl<false> *this,uoffset_t start)

{
  ushort uVar1;
  ushort *__s2;
  uint *puVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  ushort *__s1;
  uint *puVar9;
  
  if (this->nested == false) {
    __assert_fail("nested",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x1a4,
                  "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                 );
  }
  uVar4 = PushElement<int,unsigned_int>(this,0);
  uVar5 = *(int *)&this->max_voffset_ + 2;
  uVar7 = 4;
  if (4 < (ushort)uVar5) {
    uVar7 = uVar5;
  }
  this->max_voffset_ = (voffset_t)uVar7;
  vector_downward<unsigned_int>::fill_big(&this->buf_,(ulong)(uVar7 & 0xffff));
  if (0xffff < uVar4 - start) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                  ,0x1b5,
                  "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                 );
  }
  __s2 = (ushort *)(this->buf_).cur_;
  if (__s2 == (ushort *)0x0) {
    __assert_fail("cur_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector_downward.h"
                  ,0xb3,
                  "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]");
  }
  __s2[1] = (ushort)(uVar4 - start);
  *__s2 = this->max_voffset_;
  puVar2 = (uint *)(this->buf_).scratch_;
  if (puVar2 == (uint *)0x0) {
    __assert_fail("scratch_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector_downward.h"
                  ,0xbd,
                  "uint8_t *flatbuffers::vector_downward<>::scratch_end() const [SizeT = unsigned int]"
                 );
  }
  puVar9 = puVar2 + (ulong)this->num_field_loc * -2;
  puVar8 = puVar9;
  if ((ulong)this->num_field_loc != 0) {
    do {
      if (*(short *)((long)__s2 + (ulong)(ushort)puVar8[1]) != 0) {
        __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                      ,0x1c1,
                      "uoffset_t flatbuffers::FlatBufferBuilderImpl<>::EndTable(uoffset_t) [Is64Aware = false]"
                     );
      }
      *(short *)((long)__s2 + (ulong)(ushort)puVar8[1]) = (short)uVar4 - (short)*puVar8;
      puVar8 = puVar8 + 2;
    } while (puVar8 < puVar2);
  }
  (this->buf_).scratch_ = (uint8_t *)puVar9;
  this->num_field_loc = 0;
  this->max_voffset_ = 0;
  uVar7 = (this->buf_).size_;
  uVar5 = uVar7;
  if (this->dedup_vtables_ != false) {
    puVar2 = (uint *)(this->buf_).buf_;
    if (puVar2 == (uint *)0x0) {
      __assert_fail("buf_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector_downward.h"
                    ,0xb8,
                    "uint8_t *flatbuffers::vector_downward<>::scratch_data() const [SizeT = unsigned int]"
                   );
    }
    if (puVar2 < puVar9) {
      uVar1 = *__s2;
      sVar3 = (this->buf_).reserved_;
      puVar8 = puVar2;
      do {
        uVar5 = *puVar8;
        __s1 = (ushort *)((long)puVar2 + (sVar3 - uVar5));
        if ((uVar1 == *__s1) && (iVar6 = bcmp(__s1,__s2,(ulong)uVar1), iVar6 == 0)) {
          (this->buf_).cur_ = (uint8_t *)((long)__s2 + (ulong)(uVar7 - uVar4));
          (this->buf_).size_ = uVar4;
          uVar7 = uVar4;
          if (uVar5 != uVar4) goto LAB_0012a9b8;
          break;
        }
        puVar8 = puVar8 + 1;
        uVar5 = uVar7;
      } while (puVar8 < puVar9);
    }
  }
  vector_downward<unsigned_int>::ensure_space(&this->buf_,4);
  puVar2 = (uint *)(this->buf_).scratch_;
  *puVar2 = uVar7;
  (this->buf_).scratch_ = (uint8_t *)(puVar2 + 1);
LAB_0012a9b8:
  *(uint *)((this->buf_).buf_ +
           ((this->buf_).reserved_ - ((ulong)uVar4 + this->length_of_64_bit_region_))) =
       uVar5 - uVar4;
  this->nested = false;
  return uVar4;
}

Assistant:

uoffset_t EndTable(uoffset_t start) {
    // If you get this assert, a corresponding StartTable wasn't called.
    FLATBUFFERS_ASSERT(nested);
    // Write the vtable offset, which is the start of any Table.
    // We fill its value later.
    // This is relative to the end of the 32-bit region.
    const uoffset_t vtable_offset_loc =
        static_cast<uoffset_t>(PushElement<soffset_t>(0));
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    // Include space for the last offset and ensure empty tables have a
    // minimum size.
    max_voffset_ =
        (std::max)(static_cast<voffset_t>(max_voffset_ + sizeof(voffset_t)),
                   FieldIndexToOffset(0));
    buf_.fill_big(max_voffset_);
    const uoffset_t table_object_size = vtable_offset_loc - start;
    // Vtable use 16bit offsets.
    FLATBUFFERS_ASSERT(table_object_size < 0x10000);
    WriteScalar<voffset_t>(buf_.data() + sizeof(voffset_t),
                           static_cast<voffset_t>(table_object_size));
    WriteScalar<voffset_t>(buf_.data(), max_voffset_);
    // Write the offsets into the table
    for (auto it = buf_.scratch_end() - num_field_loc * sizeof(FieldLoc);
         it < buf_.scratch_end(); it += sizeof(FieldLoc)) {
      auto field_location = reinterpret_cast<FieldLoc *>(it);
      const voffset_t pos =
          static_cast<voffset_t>(vtable_offset_loc - field_location->off);
      // If this asserts, it means you've set a field twice.
      FLATBUFFERS_ASSERT(
          !ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    ClearOffsets();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = ReadScalar<voffset_t>(vt1);
    auto vt_use = GetSizeRelative32BitRegion();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    if (dedup_vtables_) {
      for (auto it = buf_.scratch_data(); it < buf_.scratch_end();
           it += sizeof(uoffset_t)) {
        auto vt_offset_ptr = reinterpret_cast<uoffset_t *>(it);
        auto vt2 = reinterpret_cast<voffset_t *>(buf_.data_at(*vt_offset_ptr));
        auto vt2_size = ReadScalar<voffset_t>(vt2);
        if (vt1_size != vt2_size || 0 != memcmp(vt2, vt1, vt1_size)) continue;
        vt_use = *vt_offset_ptr;
        buf_.pop(GetSizeRelative32BitRegion() - vtable_offset_loc);
        break;
      }
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSizeRelative32BitRegion()) {
      buf_.scratch_push_small(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the vtable is
    // stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtable_offset_loc + length_of_64_bit_region_),
                static_cast<soffset_t>(vt_use) -
                    static_cast<soffset_t>(vtable_offset_loc));
    nested = false;
    return vtable_offset_loc;
  }